

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.h
# Opt level: O3

void __thiscall mkvparser::MasteringMetadata::~MasteringMetadata(MasteringMetadata *this)

{
  operator_delete(this->r);
  operator_delete(this->g);
  operator_delete(this->b);
  operator_delete(this->white_point);
  return;
}

Assistant:

~MasteringMetadata() {
    delete r;
    delete g;
    delete b;
    delete white_point;
  }